

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.cpp
# Opt level: O3

int __thiscall argo::reader::next(reader *this)

{
  int c;
  int iVar1;
  uint uVar2;
  json_io_exception *this_00;
  ulong uVar3;
  
  iVar1 = this->m_put_back;
  if (iVar1 != 1000) {
    this->m_put_back = 1000;
    return iVar1;
  }
  if (this->m_block_read == true) {
    iVar1 = this->m_block_index;
    if ((iVar1 == -1) || (this->m_block_num_bytes <= iVar1)) {
      iVar1 = (*this->_vptr_reader[5])(this);
      uVar2 = 0xffffffff;
      if ((char)iVar1 == '\0') goto LAB_0011370e;
      iVar1 = this->m_block_index;
    }
    this->m_block_index = iVar1 + 1;
    uVar2 = (uint)this->m_block[iVar1];
  }
  else {
    uVar2 = (*this->_vptr_reader[4])(this);
  }
LAB_0011370e:
  uVar3 = this->m_byte_index + 1;
  this->m_byte_index = uVar3;
  if (uVar3 <= this->m_max_message_length) {
    return uVar2;
  }
  this_00 = (json_io_exception *)__cxa_allocate_exception(0xd8);
  json_io_exception::json_io_exception(this_00,message_too_long_e,this->m_max_message_length);
  __cxa_throw(this_00,&json_io_exception::typeinfo,std::exception::~exception);
}

Assistant:

int reader::next()
{
    if (m_put_back == no_put_back)
    {
        int res = m_block_read ?  read_next_char_from_block() : read_next_char();

        if (++m_byte_index > m_max_message_length)
        {
            throw json_io_exception(json_exception::message_too_long_e, m_max_message_length);
        }

        return res;
    }
    else
    {
        int c = m_put_back;
        m_put_back = no_put_back;
        return c;
    }
}